

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.H
# Opt level: O3

double amrex::detail::bisect_prob_hi<double>(Real plo,Real phi,Real idx,int ilo,int ihi,Real tol)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar4 = phi - tol;
  dVar5 = floor((dVar4 - plo) * idx);
  iVar2 = (int)dVar5;
  if (-1 < iVar2 && iVar2 + ilo <= ihi) {
    return dVar4;
  }
  dVar5 = phi + -0.5 / idx;
  dVar6 = floor((dVar5 - plo) * idx);
  if ((int)dVar6 < 0) {
    dVar6 = -0.5;
    dVar7 = -0.5;
    if (-1 < iVar2) goto LAB_004805ac;
  }
  else {
    dVar9 = *(double *)(&DAT_00668530 + (ulong)((int)dVar6 + ilo <= ihi) * 8);
    dVar6 = dVar9;
    if (-1 < iVar2) {
      dVar7 = dVar9;
      if ((dVar9 == 0.0) && (!NAN(dVar9))) goto LAB_00480610;
LAB_004805ac:
      dVar9 = *(double *)(&DAT_00668530 + (ulong)(iVar2 + ilo <= ihi) * 8);
      dVar6 = dVar7;
    }
    if ((dVar9 == 0.0) && (!NAN(dVar9))) goto LAB_00480610;
  }
  dVar7 = dVar5 + dVar4;
  dVar9 = dVar7 * 0.5;
  if ((tol <= dVar4 - dVar5) &&
     ((2.2250738585072014e-308 <= ABS(dVar5 - dVar4) &&
      (ABS(dVar7) * 2.220446049250313e-16 + ABS(dVar7) * 2.220446049250313e-16 < ABS(dVar5 - dVar4))
      ))) {
    uVar1 = 1;
    do {
      dVar9 = dVar7 * 0.5;
      dVar8 = floor((dVar9 - plo) * idx);
      dVar7 = -0.5;
      if (-1 < (int)dVar8) {
        dVar7 = *(double *)(&DAT_00668530 + (ulong)((int)dVar8 + ilo <= ihi) * 8);
        if ((dVar7 == 0.0) && (!NAN(dVar7))) break;
      }
      if (0.0 <= dVar6 * dVar7) {
        dVar5 = dVar9;
      }
      if ((99 < uVar1) ||
         (uVar3 = -(ulong)(dVar6 * dVar7 < 0.0),
         dVar4 = (double)(~uVar3 & (ulong)dVar4 | uVar3 & (ulong)dVar9), dVar4 - dVar5 < tol))
      break;
      dVar7 = floor((dVar5 - plo) * idx);
      dVar6 = -0.5;
      if (-1 < (int)dVar7) {
        dVar6 = *(double *)(&DAT_00668530 + (ulong)((int)dVar7 + ilo <= ihi) * 8);
      }
      dVar7 = dVar4 + dVar5;
      if ((ABS(dVar5 - dVar4) < 2.2250738585072014e-308) ||
         (uVar1 = uVar1 + 1,
         ABS(dVar5 - dVar4) <=
         ABS(dVar7) * 2.220446049250313e-16 + ABS(dVar7) * 2.220446049250313e-16)) break;
    } while( true );
  }
LAB_00480610:
  return dVar9 - tol;
}

Assistant:

T bisect_prob_hi (amrex::Real plo, amrex::Real phi, amrex::Real idx, int ilo, int ihi, amrex::Real tol) {
            T hi = static_cast<T>(phi - tol);
            bool safe;
            {
                int i = int(Math::floor((hi - plo)*idx)) + ilo;
                safe = i >= ilo && i <= ihi;
            }
            if (safe) {
                return hi;
            } else {
                // bisect the point at which the cell no longer maps to inside the domain
                T lo = static_cast<T>(phi - 0.5_rt/idx);
                T mid = bisect(lo, hi,
                               [=] AMREX_GPU_HOST_DEVICE (T x) -> T
                                   {
                                       int i = int(Math::floor((x - plo)*idx)) + ilo;
                                       bool inside = i >= ilo && i <= ihi;
                                       return static_cast<T>(inside) - T(0.5);
                                   }, static_cast<T>(tol));
                return mid - static_cast<T>(tol);
            }
        }